

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O3

bool compareInfo(DataFieldInfo *info1,DataFieldInfo *info2)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  bool bVar4;
  
  __n = (info1->type_)._M_string_length;
  if (__n == (info2->type_)._M_string_length) {
    bVar4 = true;
    if (__n == 0) goto LAB_001149ca;
    iVar1 = bcmp((info1->type_)._M_dataplus._M_p,(info2->type_)._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_001149ca;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(info1->type_)._M_dataplus._M_p,
                      (info1->type_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(info2->type_)._M_dataplus._M_p,(info2->type_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  bVar4 = false;
LAB_001149ca:
  if (info1->rank_ != info2->rank_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rank: ",6);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->rank_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->rank_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  if (info1->bytesPerElement_ != info2->bytesPerElement_) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Bytes per Element: ",0x13);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->bytesPerElement_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->bytesPerElement_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  if (info1->iSize_ != info2->iSize_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iSize: ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->iSize_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->iSize_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  if (info1->jSize_ != info2->jSize_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"jSize: ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->jSize_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->jSize_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  if (info1->kSize_ != info2->kSize_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"kSize: ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->kSize_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->kSize_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  if (info1->lSize_ != info2->lSize_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lSize: ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,info1->lSize_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,info2->lSize_);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool compareInfo(const DataFieldInfo& info1, const DataFieldInfo& info2)
{
    bool equal = true;
    if (info1.type() != info2.type()) {
        equal = false;
        std::cout << "Type: " << info1.type() << " != " << info2.type() << std::endl;
    }
    if (info1.rank() != info2.rank()) {
        equal = false;
        std::cout << "Rank: " << info1.rank() << " != " << info2.rank() << std::endl;
    }
    if (info1.bytesPerElement() != info2.bytesPerElement()) {
        equal = false;
        std::cout << "Bytes per Element: " << info1.bytesPerElement() << " != " << info2.bytesPerElement() << std::endl;
    }
    if (info1.iSize() != info2.iSize()) {
        equal = false;
        std::cout << "iSize: " << info1.iSize() << " != " << info2.iSize() << std::endl;
    }
    if (info1.jSize() != info2.jSize()) {
        equal = false;
        std::cout << "jSize: " << info1.jSize() << " != " << info2.jSize() << std::endl;
    }
    if (info1.kSize() != info2.kSize()) {
        equal = false;
        std::cout << "kSize: " << info1.kSize() << " != " << info2.kSize() << std::endl;
    }
    if (info1.lSize() != info2.lSize()) {
        equal = false;
        std::cout << "lSize: " << info1.lSize() << " != " << info2.lSize() << std::endl;
    }

    return equal;
}